

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<3>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  StateQueryMemoryWriteGuard<float[9]> state;
  StateQueryMemoryWriteGuard<float[9]> local_228;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_228.m_postguard[6] = -8.0297587e+18;
  local_228.m_postguard[7] = -8.0297587e+18;
  local_228.m_postguard[8] = -8.0297587e+18;
  local_228.m_postguard[2] = -8.0297587e+18;
  local_228.m_postguard[3] = -8.0297587e+18;
  local_228.m_postguard[4] = -8.0297587e+18;
  local_228.m_postguard[5] = -8.0297587e+18;
  local_228.m_value[7] = -8.0297587e+18;
  local_228.m_value[8] = -8.0297587e+18;
  local_228.m_postguard[0] = -8.0297587e+18;
  local_228.m_postguard[1] = -8.0297587e+18;
  local_228.m_value[3] = -8.0297587e+18;
  local_228.m_value[4] = -8.0297587e+18;
  local_228.m_value[5] = -8.0297587e+18;
  local_228.m_value[6] = -8.0297587e+18;
  local_228.m_preguard[8] = -8.0297587e+18;
  local_228.m_value[0] = -8.0297587e+18;
  local_228.m_value[1] = -8.0297587e+18;
  local_228.m_value[2] = -8.0297587e+18;
  local_228.m_preguard[4] = -8.0297587e+18;
  local_228.m_preguard[5] = -8.0297587e+18;
  local_228.m_preguard[6] = -8.0297587e+18;
  local_228.m_preguard[7] = -8.0297587e+18;
  local_228.m_preguard[0] = -8.0297587e+18;
  local_228.m_preguard[1] = -8.0297587e+18;
  local_228.m_preguard[2] = -8.0297587e+18;
  local_228.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,local_228.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::verifyValidity
                    (&local_228,testCtx);
  if (bVar2) {
    this = (ostringstream *)(local_1b0 + 8);
    iVar1 = 0;
    lVar6 = 0;
    do {
      lVar4 = 0;
      lVar5 = lVar6;
      do {
        iVar3 = iVar1 + (int)lVar4;
        if (transpose) {
          iVar3 = (int)lVar5;
        }
        if ((values[lVar4] != local_228.m_value[iVar3]) ||
           (NAN(values[lVar4]) || NAN(local_228.m_value[iVar3]))) {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"// ERROR: at index [",0x14);
          std::ostream::operator<<(this,(int)lVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"][",2);
          std::ostream::operator<<(this,(int)lVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"] expected ",0xb);
          std::ostream::_M_insert<double>((double)values[lVar4]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
          std::ostream::_M_insert<double>((double)local_228.m_value[iVar3]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base(local_138);
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 3;
      } while (lVar4 != 3);
      lVar6 = lVar6 + 1;
      values = values + 3;
      iVar1 = iVar1 + 3;
    } while (lVar6 != 3);
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}